

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversionTypeParser.cpp
# Opt level: O2

void __thiscall OpenMD::InversionTypeParser::InversionTypeParser(InversionTypeParser *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  allocator<char> local_31;
  key_type local_30;
  
  p_Var1 = &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"AmberImproper",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_30);
  *pmVar2 = itAmberImproper;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"ImproperCosine",&local_31)
  ;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_30);
  *pmVar2 = itImproperCosine;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Harmonic",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_30);
  *pmVar2 = itHarmonic;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CentralAtomHeight",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_30);
  *pmVar2 = itCentralAtomHeight;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Dreiding",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_30);
  *pmVar2 = itDreiding;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

InversionTypeParser::InversionTypeParser() {
    stringToEnumMap_["AmberImproper"]     = itAmberImproper;
    stringToEnumMap_["ImproperCosine"]    = itImproperCosine;
    stringToEnumMap_["Harmonic"]          = itHarmonic;
    stringToEnumMap_["CentralAtomHeight"] = itCentralAtomHeight;
    stringToEnumMap_["Dreiding"]          = itDreiding;
  }